

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQDelegable::SetDelegate(SQDelegable *this,SQTable *mt)

{
  long in_RSI;
  long in_RDI;
  SQTable *temp;
  long local_20;
  bool local_1;
  
  local_20 = in_RSI;
  if (in_RSI == in_RDI) {
    local_1 = false;
  }
  else {
    for (; local_20 != 0; local_20 = *(long *)(local_20 + 0x30)) {
      if (*(long *)(local_20 + 0x30) == in_RDI) {
        return false;
      }
    }
    if (in_RSI != 0) {
      *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
    }
    if (*(long *)(in_RDI + 0x30) != 0) {
      *(long *)(*(long *)(in_RDI + 0x30) + 8) = *(long *)(*(long *)(in_RDI + 0x30) + 8) + -1;
      if (*(long *)(*(long *)(in_RDI + 0x30) + 8) == 0) {
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))();
      }
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
    *(long *)(in_RDI + 0x30) = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SQDelegable::SetDelegate(SQTable *mt)
{
    SQTable *temp = mt;
    if(temp == this) return false;
    while (temp) {
        if (temp->_delegate == this) return false; //cycle detected
        temp = temp->_delegate;
    }
    if (mt) __ObjAddRef(mt);
    __ObjRelease(_delegate);
    _delegate = mt;
    return true;
}